

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void __thiscall
el::base::TypedConfigurations::build(TypedConfigurations *this,Configurations *configurations)

{
  ConfigurationType CVar1;
  Level LVar2;
  Level level;
  pointer pcVar3;
  long lVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unsigned_long uVar7;
  SubsecondPrecision SVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TypedConfigurations *this_00;
  TypedConfigurations *pTVar10;
  _Alloc_hider _Var11;
  Configuration **ppCVar12;
  bool bVar13;
  Configuration *conf;
  vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> withFileSizeLimit;
  Configuration *local_250;
  Configuration **local_248;
  iterator iStack_240;
  Configuration **local_238;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
  *local_1a8;
  unordered_map<el::Level,_el::base::SubsecondPrecision,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
  *local_1a0;
  unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *local_198;
  unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
  *local_190;
  unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *local_188;
  unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *local_180;
  unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *local_178;
  unordered_map<el::Level,_el::base::LogFormat,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
  *local_170;
  undefined1 local_168 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined1 local_128 [32];
  string_t local_108;
  undefined8 local_e8;
  undefined8 uStack_e0;
  __buckets_ptr local_d8;
  code *pcStack_d0;
  long *plVar6;
  
  (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])();
  local_248 = (Configuration **)0x0;
  iStack_240._M_current = (Configuration **)0x0;
  local_238 = (Configuration **)0x0;
  iVar5 = (*(configurations->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>
            ).
            super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
            .super_ThreadSafe._vptr_ThreadSafe[5])(configurations);
  plVar6 = (long *)CONCAT44(extraout_var,iVar5);
  local_190 = &this->m_maxLogFileSizeMap;
  local_198 = &this->m_performanceTrackingMap;
  local_1a0 = &this->m_subsecondPrecisionMap;
  local_170 = &this->m_logFormatMap;
  local_1a8 = &this->m_logFlushThresholdMap;
  local_178 = &this->m_toStandardOutputMap;
  local_180 = &this->m_toFileMap;
  local_188 = &this->m_enabledMap;
  do {
    iVar5 = (*(configurations->
              super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
              super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              .super_ThreadSafe._vptr_ThreadSafe[6])(configurations);
    if (plVar6 == (long *)CONCAT44(extraout_var_00,iVar5)) {
      iVar5 = (*(configurations->
                super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
                super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                .super_ThreadSafe._vptr_ThreadSafe[5])(configurations);
      for (plVar6 = (long *)CONCAT44(extraout_var_01,iVar5);
          iVar5 = (*(configurations->
                    super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
                    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                    .super_ThreadSafe._vptr_ThreadSafe[6])(configurations),
          plVar6 != (long *)CONCAT44(extraout_var_02,iVar5); plVar6 = plVar6 + 1) {
        lVar4 = *plVar6;
        if (*(int *)(lVar4 + 0xc) == 0x10) {
          insertFile(this,*(Level *)(lVar4 + 8),(string *)(lVar4 + 0x10));
        }
      }
      if (local_248 != iStack_240._M_current) {
        ppCVar12 = local_248;
        do {
          uStack_e0 = (__node_base_ptr)0x0;
          local_e8 = defaultPreRollOutCallback;
          pcStack_d0 = utils::std::
                       _Function_handler<void_(const_char_*,_unsigned_long),_void_(*)(const_char_*,_unsigned_long)>
                       ::_M_invoke;
          local_d8 = (__buckets_ptr)
                     utils::std::
                     _Function_handler<void_(const_char_*,_unsigned_long),_void_(*)(const_char_*,_unsigned_long)>
                     ::_M_manager;
          unsafeValidateFileRolling(this,(*ppCVar12)->m_level,(PreRollOutCallback *)&local_e8);
          if (local_d8 != (__buckets_ptr)0x0) {
            (*(code *)local_d8)((PreRollOutCallback *)&local_e8,(PreRollOutCallback *)&local_e8,3);
          }
          ppCVar12 = ppCVar12 + 1;
        } while (ppCVar12 != iStack_240._M_current);
      }
      if (local_248 != (Configuration **)0x0) {
        operator_delete(local_248);
      }
      return;
    }
    local_250 = (Configuration *)*plVar6;
    CVar1 = local_250->m_configurationType;
    if ((int)CVar1 < 0x20) {
      switch(CVar1) {
      case Enabled:
        LVar2 = local_250->m_level;
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        pcVar3 = (local_250->m_value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,pcVar3,pcVar3 + (local_250->m_value)._M_string_length);
        utils::Str::rtrim(&local_1c8);
        utils::Str::ltrim(&local_1c8);
        iVar5 = std::__cxx11::string::compare((char *)&local_1c8);
        bVar13 = true;
        if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_1c8), iVar5 != 0))
        {
          iVar5 = std::__cxx11::string::compare((char *)&local_1c8);
          bVar13 = iVar5 == 0;
        }
        local_e8._0_1_ = bVar13;
        setValue<bool>(this,LVar2,(bool *)&local_e8,local_188,true);
        _Var11._M_p = local_1c8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p == &local_1c8.field_2) goto switchD_001130af_caseD_3;
        goto LAB_0011365a;
      case ToFile:
        LVar2 = local_250->m_level;
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        pcVar3 = (local_250->m_value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,pcVar3,pcVar3 + (local_250->m_value)._M_string_length);
        utils::Str::rtrim(&local_1e8);
        utils::Str::ltrim(&local_1e8);
        iVar5 = std::__cxx11::string::compare((char *)&local_1e8);
        bVar13 = true;
        if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_1e8), iVar5 != 0))
        {
          iVar5 = std::__cxx11::string::compare((char *)&local_1e8);
          bVar13 = iVar5 == 0;
        }
        local_e8._0_1_ = bVar13;
        setValue<bool>(this,LVar2,(bool *)&local_e8,local_180,true);
        paVar9 = &local_1e8.field_2;
        _Var11._M_p = local_1e8._M_dataplus._M_p;
        break;
      default:
        goto switchD_001130af_caseD_3;
      case ToStandardOutput:
        LVar2 = local_250->m_level;
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        pcVar3 = (local_250->m_value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,pcVar3,pcVar3 + (local_250->m_value)._M_string_length);
        utils::Str::rtrim(&local_208);
        utils::Str::ltrim(&local_208);
        iVar5 = std::__cxx11::string::compare((char *)&local_208);
        bVar13 = true;
        if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_208), iVar5 != 0))
        {
          iVar5 = std::__cxx11::string::compare((char *)&local_208);
          bVar13 = iVar5 == 0;
        }
        local_e8._0_1_ = bVar13;
        setValue<bool>(this,LVar2,(bool *)&local_e8,local_178,true);
        paVar9 = &local_208.field_2;
        _Var11._M_p = local_208._M_dataplus._M_p;
        break;
      case Format:
        LVar2 = local_250->m_level;
        level = local_250->m_level;
        pcVar3 = (local_250->m_value)._M_dataplus._M_p;
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)(local_128 + 0x20),pcVar3,
                   pcVar3 + (local_250->m_value)._M_string_length);
        LogFormat::LogFormat((LogFormat *)&local_e8,level,(string_t *)(local_128 + 0x20));
        setValue<el::base::LogFormat>(this,LVar2,(LogFormat *)&local_e8,local_170,true);
        LogFormat::~LogFormat((LogFormat *)&local_e8);
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&local_108.field_2;
        _Var11._M_p = local_108._M_dataplus._M_p;
      }
LAB_00113655:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var11._M_p != paVar9) {
LAB_0011365a:
        operator_delete(_Var11._M_p);
      }
    }
    else {
      if ((int)CVar1 < 0x80) {
        if (CVar1 == MillisecondsWidth) {
          local_128._0_8_ = local_128 + 0x10;
          pcVar3 = (local_250->m_value)._M_dataplus._M_p;
          pTVar10 = (TypedConfigurations *)local_128;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_128,pcVar3,pcVar3 + (local_250->m_value)._M_string_length);
          uVar7 = getULong(pTVar10,(string *)local_128);
          local_e8._0_4_ = (int)uVar7;
          if ((int)local_e8 - 7U < 0xfffffffa) {
            local_e8._0_4_ = 3;
          }
          switch((int)local_e8) {
          default:
            local_e8._4_4_ = 1000;
            break;
          case 4:
            local_e8._4_4_ = 100;
            break;
          case 5:
            local_e8._4_4_ = 10;
            break;
          case 6:
            local_e8._4_4_ = 1;
          }
          setValue<el::base::SubsecondPrecision>
                    (this,Global,(SubsecondPrecision *)&local_e8,local_1a0,true);
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_128 + 0x10);
          _Var11._M_p = (pointer)local_128._0_8_;
        }
        else {
          if (CVar1 != PerformanceTracking) goto switchD_001130af_caseD_3;
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          pcVar3 = (local_250->m_value)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_228,pcVar3,pcVar3 + (local_250->m_value)._M_string_length);
          utils::Str::rtrim(&local_228);
          utils::Str::ltrim(&local_228);
          iVar5 = std::__cxx11::string::compare((char *)&local_228);
          bVar13 = true;
          if ((iVar5 != 0) &&
             (iVar5 = std::__cxx11::string::compare((char *)&local_228), iVar5 != 0)) {
            iVar5 = std::__cxx11::string::compare((char *)&local_228);
            bVar13 = iVar5 == 0;
          }
          local_e8._0_1_ = bVar13;
          setValue<bool>(this,Global,(bool *)&local_e8,local_198,true);
          paVar9 = &local_228.field_2;
          _Var11._M_p = local_228._M_dataplus._M_p;
        }
        goto LAB_00113655;
      }
      if (CVar1 == MaxLogFileSize) {
        local_168._0_8_ = local_168 + 0x10;
        pcVar3 = (local_250->m_value)._M_dataplus._M_p;
        pTVar10 = (TypedConfigurations *)local_168;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pTVar10,pcVar3,pcVar3 + (local_250->m_value)._M_string_length);
        SVar8 = (SubsecondPrecision)getULong(pTVar10,(string *)local_168);
        if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
          operator_delete((void *)local_168._0_8_);
        }
        local_e8 = (code *)SVar8;
        setValue<unsigned_long>(this,local_250->m_level,(unsigned_long *)&local_e8,local_190,true);
        if (SVar8 != (SubsecondPrecision)0x0) {
          if (iStack_240._M_current == local_238) {
            std::vector<el::Configuration*,std::allocator<el::Configuration*>>::
            _M_realloc_insert<el::Configuration*const&>
                      ((vector<el::Configuration*,std::allocator<el::Configuration*>> *)&local_248,
                       iStack_240,&local_250);
          }
          else {
            *iStack_240._M_current = local_250;
            iStack_240._M_current = iStack_240._M_current + 1;
          }
        }
      }
      else if (CVar1 == LogFlushThreshold) {
        LVar2 = local_250->m_level;
        local_168._32_8_ = &local_138;
        pcVar3 = (local_250->m_value)._M_dataplus._M_p;
        pTVar10 = (TypedConfigurations *)(local_168 + 0x20);
        this_00 = pTVar10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pTVar10,pcVar3,pcVar3 + (local_250->m_value)._M_string_length);
        local_e8 = (code *)getULong(this_00,(string *)pTVar10);
        setValue<unsigned_long>(this,LVar2,(unsigned_long *)&local_e8,local_1a8,true);
        paVar9 = &local_138;
        _Var11._M_p = (pointer)local_168._32_8_;
        goto LAB_00113655;
      }
    }
switchD_001130af_caseD_3:
    plVar6 = plVar6 + 1;
  } while( true );
}

Assistant:

void TypedConfigurations::build(Configurations* configurations) {
  base::threading::ScopedLock scopedLock(lock());
  auto getBool = [] (std::string boolStr) -> bool {  // Pass by value for trimming
    base::utils::Str::trim(boolStr);
    return (boolStr == "TRUE" || boolStr == "true" || boolStr == "1");
  };
  std::vector<Configuration*> withFileSizeLimit;
  for (Configurations::const_iterator it = configurations->begin(); it != configurations->end(); ++it) {
    Configuration* conf = *it;
    // We cannot use switch on strong enums because Intel C++ dont support them yet
    if (conf->configurationType() == ConfigurationType::Enabled) {
      setValue(conf->level(), getBool(conf->value()), &m_enabledMap);
    } else if (conf->configurationType() == ConfigurationType::ToFile) {
      setValue(conf->level(), getBool(conf->value()), &m_toFileMap);
    } else if (conf->configurationType() == ConfigurationType::ToStandardOutput) {
      setValue(conf->level(), getBool(conf->value()), &m_toStandardOutputMap);
    } else if (conf->configurationType() == ConfigurationType::Filename) {
      // We do not yet configure filename but we will configure in another
      // loop. This is because if file cannot be created, we will force ToFile
      // to be false. Because configuring logger is not necessarily performance
      // sensative operation, we can live with another loop; (by the way this loop
      // is not very heavy either)
    } else if (conf->configurationType() == ConfigurationType::Format) {
      setValue(conf->level(), base::LogFormat(conf->level(),
                                              base::type::string_t(conf->value().begin(), conf->value().end())), &m_logFormatMap);
    } else if (conf->configurationType() == ConfigurationType::SubsecondPrecision) {
      setValue(Level::Global,
               base::SubsecondPrecision(static_cast<int>(getULong(conf->value()))), &m_subsecondPrecisionMap);
    } else if (conf->configurationType() == ConfigurationType::PerformanceTracking) {
      setValue(Level::Global, getBool(conf->value()), &m_performanceTrackingMap);
    } else if (conf->configurationType() == ConfigurationType::MaxLogFileSize) {
      auto v = getULong(conf->value());
      setValue(conf->level(), static_cast<std::size_t>(v), &m_maxLogFileSizeMap);
      if (v != 0) {
        withFileSizeLimit.push_back(conf);
      }
    } else if (conf->configurationType() == ConfigurationType::LogFlushThreshold) {
      setValue(conf->level(), static_cast<std::size_t>(getULong(conf->value())), &m_logFlushThresholdMap);
    }
  }
  // As mentioned earlier, we will now set filename configuration in separate loop to deal with non-existent files
  for (Configurations::const_iterator it = configurations->begin(); it != configurations->end(); ++it) {
    Configuration* conf = *it;
    if (conf->configurationType() == ConfigurationType::Filename) {
      insertFile(conf->level(), conf->value());
    }
  }
  for (std::vector<Configuration*>::iterator conf = withFileSizeLimit.begin();
       conf != withFileSizeLimit.end(); ++conf) {
    // This is not unsafe as mutex is locked in currect scope
    unsafeValidateFileRolling((*conf)->level(), base::defaultPreRollOutCallback);
  }
}